

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_rectangle_rounded_lines
               (rf_rec rec,float roundness,int segments,int line_thick,rf_color color)

{
  rf_vec2 rVar1;
  rf_rec rec_00;
  _Bool _Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float x;
  float y;
  float x_00;
  float y_00;
  float fVar7;
  float fVar8;
  float local_150;
  int local_14c;
  long lStack_148;
  int i_2;
  rf_int i_1;
  float fStack_138;
  rf_vec2 center_1;
  float angle_1;
  rf_int k_1;
  rf_int i;
  float fStack_118;
  rf_vec2 center;
  float angle;
  rf_int k;
  float angles [4];
  rf_vec2 centers [4];
  rf_vec2 point [16];
  float inner_radius;
  float outer_radius;
  float step_length;
  float th;
  float CIRCLE_ERROR_RATE;
  float radius;
  int local_28;
  int local_24;
  int line_thick_local;
  int segments_local;
  float roundness_local;
  rf_color color_local;
  rf_rec rec_local;
  
  local_28 = line_thick;
  if (line_thick < 0) {
    local_28 = 0;
  }
  rec_local.y = rec.height;
  roundness_local = rec.x;
  color_local = (rf_color)rec.y;
  rec_local.x = rec.width;
  if (0.0 < roundness) {
    line_thick_local = (int)roundness;
    if (1.0 <= roundness) {
      line_thick_local = 0x3f800000;
    }
    fVar3 = rec_local.x;
    if (rec_local.y < rec_local.x) {
      fVar3 = rec_local.y;
    }
    local_150 = (fVar3 * (float)line_thick_local) / 2.0;
    if (0.0 < local_150) {
      local_24 = segments;
      if (segments < 4) {
        fVar3 = powf(1.0 - 0.5 / local_150,2.0);
        fVar3 = acosf(fVar3 + fVar3 + -1.0);
        fVar3 = ceilf(6.2831855 / fVar3);
        local_24 = (int)(fVar3 / 2.0);
        if (local_24 < 1) {
          local_24 = 4;
        }
      }
      fVar3 = 90.0 / (float)local_24;
      fVar4 = local_150 + (float)local_28;
      centers[3].x = roundness_local + local_150;
      centers[3].y = (float)color_local - (float)local_28;
      fVar5 = roundness_local + rec_local.x + (float)local_28;
      fVar6 = ((float)color_local + rec_local.y) - local_150;
      x = (roundness_local + rec_local.x) - local_150;
      y = (float)color_local + rec_local.y + (float)local_28;
      x_00 = (roundness_local + rec_local.x) - local_150;
      y_00 = ((float)color_local + rec_local.y) - local_150;
      angles[2] = roundness_local + local_150;
      angles[3] = (float)color_local + local_150;
      centers[0].x = (roundness_local + rec_local.x) - local_150;
      centers[0].y = (float)color_local + local_150;
      centers[1].x = (roundness_local + rec_local.x) - local_150;
      centers[1].y = ((float)color_local + rec_local.y) - local_150;
      centers[2].x = roundness_local + local_150;
      centers[2].y = ((float)color_local + rec_local.y) - local_150;
      angles[0] = 0.0;
      angles[1] = 270.0;
      segments_local._0_1_ = color.r;
      segments_local._1_1_ = color.g;
      segments_local._2_1_ = color.b;
      segments_local._3_1_ = color.a;
      if (local_28 < 2) {
        _Var2 = rf_gfx_check_buffer_limit(local_24 * 8 + 8);
        if (_Var2) {
          rf_gfx_draw();
        }
        rf_gfx_begin(RF_LINES);
        for (stack0xfffffffffffffed0 = 0; stack0xfffffffffffffed0 < 4;
            register0x00000000 = stack0xfffffffffffffed0 + 1) {
          center_1.x = angles[stack0xfffffffffffffed0 + -2];
          rVar1 = centers[stack0xfffffffffffffed0 + -1];
          for (lStack_148 = 0; lStack_148 < local_24; lStack_148 = lStack_148 + 1) {
            rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                            segments_local._3_1_);
            i_1._4_4_ = rVar1.x;
            fVar5 = sinf(center_1.x * 0.017453292);
            fStack_138 = rVar1.y;
            fVar6 = cosf(center_1.x * 0.017453292);
            rf_gfx_vertex2f(fVar5 * fVar4 + i_1._4_4_,fVar6 * fVar4 + fStack_138);
            fVar5 = sinf((center_1.x + fVar3) * 0.017453292);
            fVar6 = cosf((center_1.x + fVar3) * 0.017453292);
            rf_gfx_vertex2f(fVar5 * fVar4 + i_1._4_4_,fVar6 * fVar4 + fStack_138);
            center_1.x = fVar3 + center_1.x;
          }
        }
        for (local_14c = 0; local_14c < 8; local_14c = local_14c + 2) {
          rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                          segments_local._3_1_);
          rf_gfx_vertex2f(centers[(long)local_14c + 3].x,centers[(long)local_14c + 3].y);
          rf_gfx_vertex2f(centers[(long)(local_14c + 1) + 3].x,centers[(long)(local_14c + 1) + 3].y)
          ;
        }
        rf_gfx_end();
      }
      else {
        _Var2 = rf_gfx_check_buffer_limit(local_24 * 0x18 + 0x18);
        if (_Var2) {
          rf_gfx_draw();
        }
        rf_gfx_begin(RF_TRIANGLES);
        for (stack0xfffffffffffffef0 = 0; stack0xfffffffffffffef0 < 4;
            register0x00000000 = stack0xfffffffffffffef0 + 1) {
          center.x = angles[stack0xfffffffffffffef0 + -2];
          rVar1 = centers[stack0xfffffffffffffef0 + -1];
          for (k_1 = 0; k_1 < local_24; k_1 = k_1 + 1) {
            rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                            segments_local._3_1_);
            i._4_4_ = rVar1.x;
            fVar7 = sinf(center.x * 0.017453292);
            fStack_118 = rVar1.y;
            fVar8 = cosf(center.x * 0.017453292);
            rf_gfx_vertex2f(fVar7 * local_150 + i._4_4_,fVar8 * local_150 + fStack_118);
            fVar7 = sinf(center.x * 0.017453292);
            fVar8 = cosf(center.x * 0.017453292);
            rf_gfx_vertex2f(fVar7 * fVar4 + i._4_4_,fVar8 * fVar4 + fStack_118);
            fVar7 = sinf((center.x + fVar3) * 0.017453292);
            fVar8 = cosf((center.x + fVar3) * 0.017453292);
            rf_gfx_vertex2f(fVar7 * local_150 + i._4_4_,fVar8 * local_150 + fStack_118);
            fVar7 = sinf((center.x + fVar3) * 0.017453292);
            fVar8 = cosf((center.x + fVar3) * 0.017453292);
            rf_gfx_vertex2f(fVar7 * local_150 + i._4_4_,fVar8 * local_150 + fStack_118);
            fVar7 = sinf(center.x * 0.017453292);
            fVar8 = cosf(center.x * 0.017453292);
            rf_gfx_vertex2f(fVar7 * fVar4 + i._4_4_,fVar8 * fVar4 + fStack_118);
            fVar7 = sinf((center.x + fVar3) * 0.017453292);
            fVar8 = cosf((center.x + fVar3) * 0.017453292);
            rf_gfx_vertex2f(fVar7 * fVar4 + i._4_4_,fVar8 * fVar4 + fStack_118);
            center.x = fVar3 + center.x;
          }
        }
        rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                        segments_local._3_1_);
        rf_gfx_vertex2f(centers[3].x,centers[3].y);
        rf_gfx_vertex2f(roundness_local + local_150,(float)color_local);
        rf_gfx_vertex2f(x_00,(float)color_local);
        rf_gfx_vertex2f((roundness_local + rec_local.x) - local_150,
                        (float)color_local - (float)local_28);
        rf_gfx_vertex2f(centers[3].x,centers[3].y);
        rf_gfx_vertex2f(x_00,(float)color_local);
        rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                        segments_local._3_1_);
        rf_gfx_vertex2f(roundness_local + rec_local.x,(float)color_local + local_150);
        rf_gfx_vertex2f(roundness_local + rec_local.x,((float)color_local + rec_local.y) - local_150
                       );
        rf_gfx_vertex2f(fVar5,fVar6);
        rf_gfx_vertex2f(roundness_local + rec_local.x + (float)local_28,
                        (float)color_local + local_150);
        rf_gfx_vertex2f(roundness_local + rec_local.x,(float)color_local + local_150);
        rf_gfx_vertex2f(fVar5,fVar6);
        rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                        segments_local._3_1_);
        rf_gfx_vertex2f(roundness_local + local_150,(float)color_local + rec_local.y);
        rf_gfx_vertex2f(roundness_local + local_150,
                        (float)color_local + rec_local.y + (float)local_28);
        rf_gfx_vertex2f(x,y);
        rf_gfx_vertex2f((roundness_local + rec_local.x) - local_150,(float)color_local + rec_local.y
                       );
        rf_gfx_vertex2f(roundness_local + local_150,(float)color_local + rec_local.y);
        rf_gfx_vertex2f(x,y);
        rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                        segments_local._3_1_);
        rf_gfx_vertex2f(roundness_local - (float)local_28,(float)color_local + local_150);
        rf_gfx_vertex2f(roundness_local - (float)local_28,
                        ((float)color_local + rec_local.y) - local_150);
        rf_gfx_vertex2f(roundness_local,y_00);
        rf_gfx_vertex2f(roundness_local,(float)color_local + local_150);
        rf_gfx_vertex2f(roundness_local - (float)local_28,(float)color_local + local_150);
        rf_gfx_vertex2f(roundness_local,y_00);
        rf_gfx_end();
      }
    }
  }
  else {
    rec_00.y = (float)color_local - (float)local_28;
    rec_00.x = roundness_local - (float)local_28;
    rec_00.width = rec_local.x + (float)(local_28 * 2);
    rec_00.height = rec_local.y + (float)(local_28 * 2);
    rf_draw_rectangle_outline(rec_00,local_28,color);
  }
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded_lines(rf_rec rec, float roundness, int segments, int line_thick, rf_color color)
{
    if (line_thick < 0) line_thick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        rf_draw_rectangle_outline((rf_rec) {rec.x - line_thick, rec.y - line_thick, rec.width + 2 * line_thick, rec.height + 2 * line_thick}, line_thick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 2;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;
    const float outer_radius = radius + (float)line_thick, inner_radius = radius;

    /*  Quick sketch to make sense of all of this (mark the 16 + 4(corner centers P16-19) points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                     P1
     *        ====================
     *     // P8                P9 \
     *    //                        \
     *P7 // P15                  P10 \\ P2
        \\ P2
     *  ||   *P16             P17*    ||
     *  ||                            ||
     *  || P14                   P11  ||
     *P6 \\  *P19             P18*   // P3
     *    \\                        //
     *     \\ P13              P12 //
     *        ====================
     *     P5                     P4

     */
    const rf_vec2 point[16] =
            {
                    {(float)rec.x + inner_radius, rec.y - line_thick}, {(float)(rec.x + rec.width) - inner_radius, rec.y - line_thick}, { rec.x + rec.width + line_thick, (float)rec.y + inner_radius }, // PO, P1, P2
                    {rec.x + rec.width + line_thick, (float)(rec.y + rec.height) - inner_radius}, {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height + line_thick}, // P3, P4
                    {(float)rec.x + inner_radius, rec.y + rec.height + line_thick}, { rec.x - line_thick, (float)(rec.y + rec.height) - inner_radius}, {rec.x - line_thick, (float)rec.y + inner_radius}, // P5, P6, P7
                    {(float)rec.x + inner_radius, rec.y}, {(float)(rec.x + rec.width) - inner_radius, rec.y}, // P8, P9
                    { rec.x + rec.width, (float)rec.y + inner_radius }, {rec.x + rec.width, (float)(rec.y + rec.height) - inner_radius}, // P10, P11
                    {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height}, {(float)rec.x + inner_radius, rec.y + rec.height}, // P12, P13
                    { rec.x, (float)(rec.y + rec.height) - inner_radius}, {rec.x, (float)rec.y + inner_radius} // P14, P15
            };

    const rf_vec2 centers[4] =
            {
                    {(float)rec.x + inner_radius, (float)rec.y + inner_radius}, {(float)(rec.x + rec.width) - inner_radius, (float)rec.y + inner_radius}, // P16, P17
                    {(float)(rec.x + rec.width) - inner_radius, (float)(rec.y + rec.height) - inner_radius}, {(float)rec.x + inner_radius, (float)(rec.y + rec.height) - inner_radius} // P18, P19
            };

    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

    if (line_thick > 1)
    {
        if (rf_gfx_check_buffer_limit(4 * 6*segments + 4 * 6)) rf_gfx_draw(); // 4 corners with 6(2 * 3) vertices for each segment + 4 rectangles with 6 vertices each

        rf_gfx_begin(RF_TRIANGLES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

                angle += step_length;
            }
        }

        // Upper rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[8].x, point[8].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);
        rf_gfx_vertex2f(point[1].x, point[1].y);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);

        // Right rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[11].x, point[11].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);
        rf_gfx_vertex2f(point[2].x, point[2].y);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);

        // Lower rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[5].x, point[5].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);
        rf_gfx_vertex2f(point[12].x, point[12].y);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);

        // Left rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[6].x, point[6].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_vertex2f(point[15].x, point[15].y);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_end();

    }
    else
    {
        // Use LINES to draw the outline
        if (rf_gfx_check_buffer_limit(8*segments + 4 * 2)) rf_gfx_draw(); // 4 corners with 2 vertices for each segment + 4 rectangles with 2 vertices each

        rf_gfx_begin(RF_LINES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);
                angle += step_length;
            }
        }
        // And now the remaining 4 lines
        for(int i = 0; i < 8; i += 2)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(point[i].x, point[i].y);
            rf_gfx_vertex2f(point[i + 1].x, point[i + 1].y);
        }
        rf_gfx_end();
    }
}